

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::TagBelief::Update(TagBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  BaseTag *pBVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppSVar4;
  const_reference ppSVar5;
  value_type local_48;
  int local_3c;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvStack_38;
  int i_1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *new_particles;
  long *plStack_28;
  int i;
  Belief *updated;
  OBS_TYPE obs_local;
  TagBelief *pTStack_10;
  ACT_TYPE action_local;
  TagBelief *this_local;
  
  updated = (Belief *)obs;
  obs_local._4_4_ = action;
  pTStack_10 = this;
  plStack_28 = (long *)(**(code **)(*(long *)this->tag_model_ + 0x108))
                                 (this->tag_model_,this,action,obs);
  new_particles._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)new_particles._4_4_;
    sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                       &this->field_0x40);
    if (sVar3 <= uVar2) break;
    pBVar1 = this->tag_model_;
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         &this->field_0x40,(long)new_particles._4_4_);
    (**(code **)(*(long *)pBVar1 + 0xf0))(pBVar1,*ppSVar4);
    new_particles._4_4_ = new_particles._4_4_ + 1;
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::clear
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&this->field_0x40);
  pvStack_38 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
               (**(code **)(*plStack_28 + 0x30))();
  local_3c = 0;
  while( true ) {
    uVar2 = (ulong)local_3c;
    sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(pvStack_38);
    if (sVar3 <= uVar2) break;
    pBVar1 = this->tag_model_;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (pvStack_38,(long)local_3c);
    local_48 = (value_type)(**(code **)(*(long *)pBVar1 + 0xe8))(pBVar1,*ppSVar5);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&this->field_0x40,
               &local_48);
    local_3c = local_3c + 1;
  }
  if (plStack_28 != (long *)0x0) {
    (**(code **)(*plStack_28 + 8))();
  }
  return;
}

Assistant:

void TagBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	Belief* updated = tag_model_->Tau(this, action, obs);

	for (int i = 0; i < particles_.size(); i++)
		tag_model_->Free(particles_[i]);
	particles_.clear();

	const vector<State*>& new_particles =
		static_cast<ParticleBelief*>(updated)->particles();
	for (int i = 0; i < new_particles.size(); i++)
		particles_.push_back(tag_model_->Copy(new_particles[i]));

	delete updated;
}